

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

property_name_and_value * __thiscall
mjs::parser::parse_property_name_and_value
          (property_name_and_value *__return_storage_ptr__,parser *this)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__lhs;
  bool bVar1;
  bool bVar2;
  int iVar3;
  wostream *pwVar4;
  expression *e;
  _Alloc_hider _Var5;
  wchar_t *in_R9;
  wstring_view message;
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_240;
  undefined8 local_220;
  source_extend local_208;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> id;
  token local_1d0;
  wostringstream _oss;
  
  parse_property_name((parser *)&_oss);
  _Var5._M_p = __oss;
  local_270._8_8_ = __oss;
  if (((1 < (int)this->version_) && ((this->current_token_).type_ != colon)) &&
     (iVar3 = (**(code **)(*(long *)__oss + 0x18))(__oss), iVar3 == 0)) {
    __lhs = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
            (_Var5._M_p + 8);
    bVar1 = std::operator==(__lhs,L"get");
    if ((bVar1) || (bVar2 = std::operator==(__lhs,L"set"), bVar2)) {
      parse_property_name((parser *)local_270);
      std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     &_oss,__lhs,L" ");
      property_name_string_abi_cxx11_((wstring *)local_260,(mjs *)local_270._0_8_,e);
      std::operator+(&id,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                          *)&_oss,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_260);
      std::__cxx11::wstring::~wstring((wstring *)local_260);
      std::__cxx11::wstring::~wstring((wstring *)&_oss);
      parse_function_abi_cxx11_
                ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                  *)local_260,this);
      if ((long)(local_260._16_8_ - local_260._8_8_) >> 5 != (ulong)!bVar1) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)&_oss);
        pwVar4 = std::operator<<((wostream *)&_oss,"Wrong number of arguments to ");
        pwVar4 = std::operator<<(pwVar4,(wstring *)__lhs);
        pwVar4 = std::operator<<(pwVar4," ");
        pwVar4 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar4);
        pwVar4 = std::operator<<(pwVar4," expected ");
        std::wostream::_M_insert<unsigned_long>((ulong)pwVar4);
        current_extend(&local_208,this);
        std::__cxx11::wstringbuf::str();
        message._M_str = in_R9;
        message._M_len = local_240.field_2._8_8_;
        syntax_error((parser *)"parse_property_name_and_value",(char *)0x449,(int)&local_208,
                     (source_extend *)local_220,message);
      }
      make_expression<mjs::function_expression,mjs::source_extend&,std::__cxx11::wstring_const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                ((parser *)&_oss,(source_extend *)this,&local_240,
                 (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  *)&id,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                        (local_260 + 8));
      property_name_and_value::property_name_and_value
                (__return_storage_ptr__,set - bVar1,(expression_ptr *)local_270,
                 (expression_ptr *)&_oss);
      if ((element_type *)__oss != (element_type *)0x0) {
        (**(code **)(*(long *)__oss + 8))();
      }
      std::
      _Tuple_impl<0UL,_mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                      *)local_260);
      std::__cxx11::wstring::~wstring((wstring *)&id);
      if ((expression *)local_270._0_8_ != (expression *)0x0) {
        (**(code **)(*(long *)local_270._0_8_ + 8))();
      }
      goto LAB_001696e8;
    }
  }
  expect(&local_1d0,this,colon,"parse_property_name_and_value",0x451);
  token::destroy(&local_1d0);
  parse_assignment_expression((parser *)&_oss);
  property_name_and_value::property_name_and_value
            (__return_storage_ptr__,normal,(expression_ptr *)(local_270 + 8),(expression_ptr *)&_oss
            );
  if ((element_type *)__oss != (element_type *)0x0) {
    (**(code **)(*(long *)__oss + 8))();
  }
  _Var5._M_p = (pointer)local_270._8_8_;
  if ((element_type *)local_270._8_8_ == (element_type *)0x0) {
    return __return_storage_ptr__;
  }
LAB_001696e8:
  (**(code **)(*(long *)_Var5._M_p + 8))(_Var5._M_p);
  return __return_storage_ptr__;
}

Assistant:

property_name_and_value parser::parse_property_name_and_value() {
    expression_ptr p;
    {
        p = parse_property_name();
        // get/set i.e. accessor properties
        if (version_ >= version::es5 && current_token_type() != token_type::colon && p->type() == expression_type::identifier) {
            const auto& p_id = static_cast<const identifier_expression&>(*p).id();
            const bool is_get = p_id == L"get";
            if (is_get || p_id == L"set") {
                auto new_p = parse_property_name();
                const auto id = p_id + L" " + property_name_string(*new_p);
                auto [extend, params, block] = parse_function();
                const size_t expected_args = is_get ? 0 : 1;
                if (expected_args != params.size()) {
                    SYNTAX_ERROR("Wrong number of arguments to " << p_id << " " << params.size() << " expected " << expected_args);
                }

                auto f = make_expression<function_expression>(extend, id, std::move(params), std::move(block));
                return property_name_and_value{is_get ? property_assignment_type::get : property_assignment_type::set, std::move(new_p), std::move(f)};
            }
        }
    }
    EXPECT(token_type::colon);
    return property_name_and_value{property_assignment_type::normal, std::move(p), parse_assignment_expression()};
}